

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitDestructuredObject
               (ParseNode *lhs,RegSlot rhsLocationOrig,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  OpCode OVar1;
  ParseNodePtr pPVar2;
  ParseNode *this;
  code *pcVar3;
  ByteCodeGenerator *pBVar4;
  ByteCodeWriter *pBVar5;
  bool bVar6;
  ByteCodeLabel labelID;
  RegSlot RVar7;
  BOOL BVar8;
  RegSlot destinationRegister;
  undefined4 *puVar9;
  ParseNodeObjLit *pPVar10;
  uint *buffer;
  ParseNodeBin *pPVar11;
  char *byteCodeGenerator_00;
  uint uVar12;
  uint32 staticCount;
  ParseNodePtr *ppPVar13;
  FuncInfo *pFVar14;
  ByteCodeWriter *this_00;
  ParseNodePtr local_78;
  ParseNode *local_70;
  uint local_64;
  ParseNodePtr local_60;
  ByteCodeGenerator *local_58;
  ByteCodeWriter *local_50;
  uint32 local_44;
  FuncInfo *pFStack_40;
  uint32 index;
  RegSlot local_38;
  bool local_32;
  bool local_31;
  bool hasComputedProps;
  
  local_58 = byteCodeGenerator;
  pFStack_40 = funcInfo;
  local_38 = rhsLocationOrig;
  if (lhs->nop != knopObjectPattern) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1bdf,"(lhs->nop == knopObjectPattern)","lhs->nop == knopObjectPattern");
    if (!bVar6) goto LAB_0081b209;
    *puVar9 = 0;
  }
  pPVar10 = ParseNode::AsParseNodeObjLit(lhs);
  pBVar4 = local_58;
  pPVar2 = (pPVar10->super_ParseNodeUni).pnode1;
  local_50 = (ByteCodeWriter *)(ulong)pPVar10->staticCount;
  local_64 = pPVar10->computedCount;
  local_31 = pPVar10->hasRest;
  local_32 = false;
  local_70 = lhs;
  ByteCodeGenerator::StartStatement(local_58,lhs);
  this_00 = &pBVar4->m_writer;
  labelID = Js::ByteCodeWriter::DefineLabel(this_00);
  pFVar14 = pFStack_40;
  RVar7 = FuncInfo::AcquireTmpRegister(pFStack_40);
  Js::ByteCodeWriter::Reg2(this_00,Ld_A,RVar7,local_38);
  local_38 = RVar7;
  Js::ByteCodeWriter::BrReg2(this_00,BrNeq_A,labelID,RVar7,pFVar14->undefinedConstantRegister);
  Js::ByteCodeWriter::W1(this_00,RuntimeTypeError,0x1610);
  Js::ByteCodeWriter::MarkLabel(this_00,labelID);
  pBVar5 = local_50;
  local_60 = pPVar2;
  if (pPVar2 != (ParseNodePtr)0x0) {
    destinationRegister = 0xffffffff;
    pFVar14 = pFStack_40;
    RVar7 = 0xffffffff;
    if (local_31 != false) {
      uVar12 = (uint)local_50;
      if ((0x3fffffff < uVar12) || (0x3ffffffd < uVar12)) {
        Math::DefaultOverflowPolicy();
      }
      byteCodeGenerator_00 = (char *)local_58->alloc;
      BVar8 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar8 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar6) goto LAB_0081b209;
        *puVar9 = 0;
      }
      buffer = (uint *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                       AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                      *)byteCodeGenerator_00,(long)pBVar5 * 4 + 8);
      if (buffer == (uint *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        byteCodeGenerator_00 =
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
        ;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x20d,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar6) goto LAB_0081b209;
        *puVar9 = 0;
      }
      *buffer = uVar12;
      buffer[1] = 0;
      OVar1 = local_60->nop;
      if (((OVar1 != knopEllipsis) && (OVar1 != knopList)) && (OVar1 != knopObjectPatternMember)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        byteCodeGenerator_00 =
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
        ;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1bfa,
                           "(pnode1->nop == knopList || pnode1->nop == knopObjectPatternMember || pnode1->nop == knopEllipsis)"
                           ,
                           "pnode1->nop == knopList || pnode1->nop == knopObjectPatternMember || pnode1->nop == knopEllipsis"
                          );
        if (!bVar6) {
LAB_0081b209:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
      }
      staticCount = (uint32)local_50;
      EmitObjectPropertyIdsToArray
                ((ByteCodeGenerator *)byteCodeGenerator_00,(PropertyId *)(buffer + 2),local_60,
                 staticCount,&local_32);
      destinationRegister = FuncInfo::AcquireTmpRegister(pFStack_40);
      Js::ByteCodeWriter::Auxiliary
                (this_00,LdPropIds,destinationRegister,buffer,(int)((long)pBVar5 * 4) + 8,
                 staticCount);
      pFVar14 = pFStack_40;
      RVar7 = destinationRegister;
      if (local_32 == true) {
        RVar7 = FuncInfo::AcquireTmpRegister(pFStack_40);
        Js::ByteCodeWriter::Reg1Unsigned1(this_00,NewPropIdArrForCompProps,RVar7,local_64);
      }
    }
    bVar6 = local_31;
    local_50 = this_00;
    local_44 = 0;
    ppPVar13 = &local_78;
    local_78 = local_60;
    do {
      this = *ppPVar13;
      if (this == (ParseNode *)0x0) break;
      if (this->nop == knopList) {
        pPVar11 = ParseNode::AsParseNodeBin(this);
        EmitDestructuredObjectMember
                  (pPVar11->pnode1,local_38,destinationRegister,RVar7,&local_44,bVar6,local_58,
                   pFVar14);
        pPVar11 = ParseNode::AsParseNodeBin(*ppPVar13);
        ppPVar13 = &pPVar11->pnode2;
      }
      else {
        EmitDestructuredObjectMember
                  (*ppPVar13,local_38,destinationRegister,RVar7,&local_44,bVar6,local_58,pFVar14);
        ppPVar13 = (ParseNodePtr *)0x0;
      }
    } while (ppPVar13 != (ParseNodePtr *)0x0);
    this_00 = local_50;
    if (local_31 != false) {
      if (local_32 == true) {
        FuncInfo::ReleaseTmpRegister(pFVar14,RVar7);
      }
      FuncInfo::ReleaseTmpRegister(pFVar14,destinationRegister);
    }
  }
  FuncInfo::ReleaseTmpRegister(pFStack_40,local_38);
  Js::ByteCodeWriter::EndStatement(this_00,local_70);
  return;
}

Assistant:

void EmitDestructuredObject(ParseNode *lhs,
    Js::RegSlot rhsLocationOrig,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo)
{
    Assert(lhs->nop == knopObjectPattern);
    ParseNodeObjLit *pnodeObjLit = lhs->AsParseNodeObjLit();
    ParseNodePtr pnode1 = pnodeObjLit->pnode1;
    uint32 staticCount = pnodeObjLit->staticCount;
    uint32 computedCount = pnodeObjLit->computedCount;
    bool hasRest = pnodeObjLit->hasRest;
    bool hasComputedProps = false;

    byteCodeGenerator->StartStatement(lhs);

    Js::ByteCodeLabel skipThrow = byteCodeGenerator->Writer()->DefineLabel();
    Js::RegSlot rhsLocation = funcInfo->AcquireTmpRegister();
    byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, rhsLocation, rhsLocationOrig);
    byteCodeGenerator->Writer()->BrReg2(Js::OpCode::BrNeq_A, skipThrow, rhsLocation, funcInfo->undefinedConstantRegister);
    byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(JSERR_ObjectCoercible));
    byteCodeGenerator->Writer()->MarkLabel(skipThrow);

    if (pnode1 != nullptr)
    {
        Js::RegSlot propIdArrLocation = Js::Constants::NoRegister;
        Js::RegSlot computedPropIdArrLocation = Js::Constants::NoRegister;
        if (hasRest)
        {
            uint extraAlloc = UInt32Math::Mul(staticCount, sizeof(Js::PropertyId));
            uint auxSize = UInt32Math::Add(sizeof(Js::PropertyIdArray), extraAlloc);
            Js::PropertyIdArray *propIds = AnewPlus(byteCodeGenerator->GetAllocator(), extraAlloc, Js::PropertyIdArray, staticCount, 0);

            Assert(pnode1->nop == knopList || pnode1->nop == knopObjectPatternMember || pnode1->nop == knopEllipsis);

            EmitObjectPropertyIdsToArray(byteCodeGenerator, propIds->elements, pnode1, staticCount, &hasComputedProps);

            // Load static PropertyIdArray here
            propIdArrLocation = funcInfo->AcquireTmpRegister();
            byteCodeGenerator->Writer()->Auxiliary(Js::OpCode::LdPropIds, propIdArrLocation, propIds, auxSize, staticCount);

            if (hasComputedProps)
            {
                computedPropIdArrLocation = funcInfo->AcquireTmpRegister();
                byteCodeGenerator->Writer()->Reg1Unsigned1(Js::OpCode::NewPropIdArrForCompProps, computedPropIdArrLocation, computedCount);
            }
            else
            {
                computedPropIdArrLocation = propIdArrLocation;
            }
        }

        uint32 index = 0;
        Parser::ForEachItemInList(pnode1, [&](ParseNodePtr memberNode) {
            EmitDestructuredObjectMember(memberNode, rhsLocation, propIdArrLocation, computedPropIdArrLocation, 
                &index, hasRest, byteCodeGenerator, funcInfo);
        });

        if (hasRest)
        {
            if (hasComputedProps)
            {
                funcInfo->ReleaseTmpRegister(computedPropIdArrLocation);
            }
            funcInfo->ReleaseTmpRegister(propIdArrLocation);
        }
    }

    funcInfo->ReleaseTmpRegister(rhsLocation);
    
    byteCodeGenerator->EndStatement(lhs);
}